

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O2

void __thiscall
crnlib::ktx_texture::add_image
          (ktx_texture *this,uint face_index,uint mip_index,void *pImage,uint image_size)

{
  uint32 uVar1;
  uint32 uVar2;
  vector<unsigned_char> *pvVar3;
  uint uVar4;
  
  uVar1 = (this->m_header).m_pixelDepth;
  uVar2 = (this->m_header).m_numberOfArrayElements;
  uVar4 = (mip_index * (this->m_header).m_numberOfFaces * (uVar2 + (uVar2 == 0)) + face_index) *
          (uVar1 + (uVar1 == 0));
  if ((this->m_image_data).m_size <= uVar4) {
    vector<crnlib::vector<unsigned_char>_>::resize(&this->m_image_data,uVar4 + 1,false);
  }
  if (image_size != 0) {
    pvVar3 = (this->m_image_data).m_p;
    vector<unsigned_char>::resize(pvVar3 + uVar4,image_size,false);
    memcpy(pvVar3[uVar4].m_p,pImage,(ulong)image_size);
    return;
  }
  return;
}

Assistant:

void add_image(uint face_index, uint mip_index, const void* pImage, uint image_size)
        {
            const uint image_index = get_image_index(mip_index, 0, face_index, 0);
            if (image_index >= m_image_data.size())
            {
                m_image_data.resize(image_index + 1);
            }
            if (image_size)
            {
                uint8_vec& v = m_image_data[image_index];
                v.resize(image_size);
                memcpy(&v[0], pImage, image_size);
            }
        }